

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zeFabricVertexGetDeviceExp(ze_fabric_vertex_handle_t hVertex,ze_device_handle_t *phDevice)

{
  ze_result_t zVar1;
  
  if (DAT_0010e710 != (code *)0x0) {
    zVar1 = (*DAT_0010e710)();
    return zVar1;
  }
  context_t::get()::count = (ze_device_handle_t)((long)context_t::get()::count + 1);
  *phDevice = context_t::get()::count;
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricVertexGetDeviceExp(
        ze_fabric_vertex_handle_t hVertex,              ///< [in] handle of the fabric vertex
        ze_device_handle_t* phDevice                    ///< [out] device handle corresponding to fabric vertex
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetDeviceExp = context.zeDdiTable.FabricVertexExp.pfnGetDeviceExp;
        if( nullptr != pfnGetDeviceExp )
        {
            result = pfnGetDeviceExp( hVertex, phDevice );
        }
        else
        {
            // generic implementation
            *phDevice = reinterpret_cast<ze_device_handle_t>( context.get() );

        }

        return result;
    }